

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_ls.c
# Opt level: O0

int IDASetIncrementFactorB(void *ida_mem,int which,sunrealtype dqincfacB)

{
  IDALsMemB *in_XMM0_Qa;
  int retval;
  void *ida_memB;
  IDALsMemB idalsB_mem;
  IDABMem IDAB_mem;
  IDAMem IDA_mem;
  IDAadjMem IDAADJ_mem;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  char *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  void *in_stack_ffffffffffffffc8;
  int local_4;
  
  local_4 = idaLs_AccessLMemB(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
                              in_stack_ffffffffffffffb8,
                              (IDAMem *)
                              CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                              (IDAadjMem *)&stack0xffffffffffffffc0,(IDABMem *)0x137730,in_XMM0_Qa);
  if (local_4 == 0) {
    local_4 = IDASetIncrementFactor
                        (in_stack_ffffffffffffffc8,
                         (sunrealtype)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0))
    ;
  }
  return local_4;
}

Assistant:

int IDASetIncrementFactorB(void* ida_mem, int which, sunrealtype dqincfacB)
{
  IDAadjMem IDAADJ_mem;
  IDAMem IDA_mem;
  IDABMem IDAB_mem;
  IDALsMemB idalsB_mem;
  void* ida_memB;
  int retval;

  /* access relevant memory structures */
  retval = idaLs_AccessLMemB(ida_mem, which, "IDASetIncrementFactorB", &IDA_mem,
                             &IDAADJ_mem, &IDAB_mem, &idalsB_mem);
  if (retval != IDALS_SUCCESS) { return (retval); }

  /* call corresponding routine for IDAB_mem structure */
  ida_memB = (void*)IDAB_mem->IDA_mem;
  return (IDASetIncrementFactor(ida_memB, dqincfacB));
}